

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

void archive_xml_version(archive_string *str)

{
  char *p;
  archive_string *str_local;
  
  archive_strcat(str," libxml2/");
  p = archive_libxml2_version();
  archive_strcat(str,p);
  return;
}

Assistant:

static void
archive_xml_version(struct archive_string* str)
{
#if HAVE_LIBXML_XMLVERSION_H && HAVE_LIBXML2
	archive_strcat(str, " libxml2/");
	archive_strcat(str, archive_libxml2_version());
#elif HAVE_BSDXML_H && HAVE_LIBBSDXML
	archive_strcat(str, " bsdxml/");
	archive_strcat(str, archive_libbsdxml_version());
#elif HAVE_EXPAT_H && HAVE_LIBEXPAT
	archive_strcat(str, " expat/");
	archive_strcat(str, archive_libexpat_version());
#else
	(void)str; /* UNUSED */
#endif
}